

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_font_atlas_bake(nk_font_atlas *atlas,int *width,int *height,nk_font_atlas_format fmt)

{
  nk_font_config **ppnVar1;
  float *scanline;
  nk_vec2 *pnVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  nk_tt__point nVar5;
  nk_tt__point nVar6;
  undefined4 uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined4 uVar11;
  nk_rune unicode;
  undefined4 uVar12;
  nk_byte *data;
  uchar *puVar13;
  undefined4 uVar16;
  undefined8 *puVar14;
  nk_baked_font *pnVar15;
  undefined1 auVar17 [16];
  short sVar18;
  short sVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  nk_vec2 nVar26;
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkuint10 Var29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  unkbyte10 Var33;
  undefined1 auVar34 [13];
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  uint6 uVar43;
  undefined1 auVar44 [16];
  int iVar45;
  nk_uint nVar46;
  nk_uint nVar47;
  nk_uint nVar48;
  nk_uint nVar49;
  nk_uint nVar50;
  nk_uint nVar51;
  nk_uint nVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  nk_tt__active_edge *z;
  nk_font *pnVar56;
  nk_font_glyph *pnVar57;
  nk_font_config *pnVar58;
  uint *puVar59;
  void *pvVar60;
  nk_font_config *pnVar61;
  nk_tt__point *pnVar62;
  nk_tt__point *points;
  nk_tt__edge *p;
  nk_tt__edge *pnVar63;
  undefined8 *puVar64;
  long *plVar65;
  ushort uVar66;
  float *pfVar67;
  nk_tt__active_edge *pnVar68;
  nk_tt__active_edge *pnVar69;
  float *pfVar70;
  nk_vec2 *pnVar71;
  nk_handle *pnVar72;
  void *pvVar73;
  nk_font_config *pnVar74;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  ulong uVar75;
  nk_size size;
  nk_size extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar76;
  ulong extraout_RDX_01;
  ulong uVar77;
  short *psVar78;
  nk_uint encoding_record;
  uint uVar79;
  nk_tt_fontinfo *pnVar80;
  long lVar81;
  undefined1 uVar82;
  nk_tt__edge *pnVar83;
  ulong uVar84;
  int iVar85;
  nk_rune *pnVar86;
  nk_handle nVar87;
  byte *pbVar88;
  int iVar89;
  int iVar90;
  uint uVar91;
  uint uVar92;
  int iVar93;
  long lVar94;
  long lVar95;
  byte *pbVar96;
  int iVar97;
  long lVar98;
  int iVar99;
  nk_handle *alloc;
  bool bVar100;
  byte bVar101;
  char cVar112;
  char cVar113;
  float sum;
  nk_recti nVar105;
  float fVar102;
  char cVar114;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar103;
  float fVar104;
  undefined1 auVar109 [16];
  float fVar115;
  short sVar118;
  ushort uVar119;
  ushort uVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  ushort uVar121;
  ushort uVar125;
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 in_XMM3 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar134 [16];
  nk_rune local_488;
  float ya;
  int x1;
  long local_3f0;
  ulong local_3e8;
  float local_3dc;
  int local_3d8;
  int local_3d4;
  nk_font_config *local_3d0;
  undefined8 local_3c8;
  nk_tt_fontinfo *local_3c0;
  nk_tt__point *local_3b8;
  ulong local_3b0;
  nk_handle *local_3a8;
  ulong local_3a0;
  nk_font_glyph *local_398;
  long local_390;
  nk_font_atlas_format local_388;
  uint local_384;
  uint local_380;
  int local_37c;
  int y0_1;
  int x0_1;
  int iy0;
  int ix0;
  int y0;
  nk_handle nStack_360;
  nk_handle local_358;
  undefined8 *local_350;
  nk_tt__active_edge *local_348;
  int local_340;
  undefined1 local_338 [16];
  nk_font_config *local_320;
  void *local_318;
  long local_310;
  long local_308;
  long local_300;
  float local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  long local_2e0;
  nk_font_config *local_2d8;
  long local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  long local_2b8;
  long local_2b0;
  nk_tt__edge *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined4 *local_288;
  long local_280;
  ulong local_278;
  int local_270;
  int x1_1;
  nk_handle local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  int x0;
  nk_rp_coord nStack_234;
  nk_rp_coord nStack_232;
  uint uStack_230;
  int iStack_22c;
  undefined8 local_228;
  nk_rune *pnStack_220;
  ushort uVar135;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar106 [16];
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x353f,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3540,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3541,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3542,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3543,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3545,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3546,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar93 = atlas->font_num;
  local_388 = fmt;
  if (iVar93 == 0) {
    pnVar56 = nk_font_atlas_add_default(atlas,13.0,(nk_font_config *)0x0);
    atlas->default_font = pnVar56;
    iVar93 = atlas->font_num;
    if (iVar93 == 0) {
      __assert_fail("atlas->font_num",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x3551,
                    "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                   );
    }
  }
  pnVar61 = atlas->config;
  if (pnVar61 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3139,
                  "void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)");
  }
  atlas->glyph_count = 0;
  iVar45 = 0;
  iVar99 = 0;
  for (; pnVar74 = pnVar61, pnVar61 != (nk_font_config *)0x0; pnVar61 = pnVar61->next) {
    do {
      pnVar86 = pnVar74->range;
      if (pnVar86 == (nk_rune *)0x0) {
        pnVar61->range = nk_font_default_glyph_ranges::ranges;
        pnVar86 = pnVar74->range;
      }
      iVar45 = nk_range_count(pnVar86);
      iVar99 = iVar99 + iVar45;
      iVar45 = nk_range_glyph_count(pnVar74->range,iVar45);
      iVar45 = iVar45 + atlas->glyph_count;
      atlas->glyph_count = iVar45;
      ppnVar1 = &pnVar74->n;
      pnVar74 = *ppnVar1;
    } while (*ppnVar1 != pnVar61);
  }
  local_318 = (*(atlas->temporary).alloc)
                        ((atlas->temporary).userdata,(void *)0x0,
                         (long)iVar99 * 0x28 + (long)iVar45 * 0x2c + (long)iVar93 * 0x48 + 0x88);
  if (local_318 == (void *)0x0) {
    __assert_fail("tmp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3557,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar93 = atlas->glyph_count;
  iVar45 = atlas->font_num;
  alloc = (nk_handle *)((long)local_318 + 7U & 0xfffffffffffffff8);
  pnVar72 = alloc + 0xd;
  alloc[9].ptr = pnVar72;
  alloc[10].ptr = pnVar72 + (long)iVar45 * 9;
  pvVar73 = (void *)((long)iVar93 * 0x1c + (long)(pnVar72 + (long)iVar45 * 9));
  alloc[0xb].ptr = pvVar73;
  alloc[0xc].ptr = (void *)((long)pvVar73 + (long)iVar93 * 0x10 + 7 & 0xfffffffffffffff8);
  nVar87 = (nk_handle)(atlas->temporary).alloc;
  *alloc = (atlas->temporary).userdata;
  alloc[1] = nVar87;
  alloc[2] = (nk_handle)(atlas->temporary).free;
  pnVar57 = (nk_font_glyph *)
            (*(atlas->permanent).alloc)
                      ((atlas->permanent).userdata,(void *)0x0,(long)atlas->glyph_count * 0x30);
  atlas->glyphs = pnVar57;
  if (pnVar57 == (nk_font_glyph *)0x0) {
    __assert_fail("atlas->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x355e,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  (atlas->custom).w = 0xb5;
  (atlas->custom).h = 0x1c;
  pnVar61 = atlas->config;
  if (pnVar61 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x316f,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  local_3f0 = CONCAT44(local_3f0._4_4_,atlas->font_num);
  if (atlas->font_num == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3170,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  iVar93 = 0;
  uVar91 = 0;
  for (pnVar74 = pnVar61; pnVar58 = pnVar74, pnVar74 != (nk_font_config *)0x0;
      pnVar74 = pnVar74->next) {
    do {
      iVar45 = nk_range_count(pnVar58->range);
      uVar91 = uVar91 + iVar45;
      iVar45 = nk_range_glyph_count(pnVar58->range,iVar45);
      iVar93 = iVar93 + iVar45;
      ppnVar1 = &pnVar58->n;
      pnVar58 = *ppnVar1;
    } while (*ppnVar1 != pnVar74);
  }
  pvVar73 = alloc[9].ptr;
  lVar94 = 0;
  pnVar74 = pnVar61;
  do {
    if (pnVar74 == (nk_font_config *)0x0) {
      *height = 0;
      uVar79 = (uint)(1000 < iVar93) * 0x200;
      iVar45 = uVar79 + 0x200;
      *width = iVar45;
      uVar92 = uVar79 | 0x1ff;
      puVar59 = (uint *)(*(atlas->temporary).alloc)((atlas->temporary).userdata,(void *)0x0,0x48);
      pvVar73 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(ulong)(uVar92 << 4));
      if ((puVar59 == (uint *)0x0) || (pvVar73 == (void *)0x0)) {
        if (puVar59 != (uint *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,puVar59);
        }
        if (pvVar73 != (void *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar73);
        }
      }
      else {
        alloc[4].id = iVar45;
        *(undefined4 *)((long)alloc + 0x24) = 0x8000;
        alloc[7].ptr = (void *)0x0;
        alloc[3].ptr = puVar59;
        alloc[8].ptr = pvVar73;
        *(undefined4 *)((long)alloc + 0x2c) = 1;
        alloc[5].id = iVar45;
        alloc[6].ptr = (void *)0x100000001;
        uVar79 = uVar79 + 0x1fe;
        uVar77 = (ulong)uVar79;
        pvVar60 = pvVar73;
        while( true ) {
          bVar100 = uVar77 == 0;
          uVar77 = uVar77 - 1;
          if (bVar100) break;
          *(void **)((long)pvVar60 + 8) = (void *)((long)pvVar60 + 0x10);
          pvVar60 = (void *)((long)pvVar60 + 0x10);
        }
        *(undefined8 *)((long)pvVar73 + (ulong)uVar79 * 0x10 + 8) = 0;
        puVar59[3] = 1;
        puVar59[4] = 0;
        *(void **)(puVar59 + 8) = pvVar73;
        *(uint **)(puVar59 + 6) = puVar59 + 10;
        *puVar59 = uVar92;
        puVar59[1] = 0x7fff;
        puVar59[5] = uVar92;
        puVar59[2] = (uVar92 + uVar79) / uVar92;
        puVar59[10] = 0;
        *(uint **)(puVar59 + 0xc) = puVar59 + 0xe;
        *(short *)(puVar59 + 0xe) = (short)uVar92;
        *(undefined2 *)((long)puVar59 + 0x3a) = 0xffff;
        puVar59[0x10] = 0;
        puVar59[0x11] = 0;
      }
      local_3a8 = alloc + 3;
      nk_zero((nk_rp_rect *)&x0,0x10);
      nStack_234 = (atlas->custom).w;
      nStack_232 = (atlas->custom).h;
      alloc[6].ptr = (void *)0x100000001;
      nk_rp_pack_rects((nk_rp_context *)alloc[3].ptr,(nk_rp_rect *)&x0,1);
      iVar45 = ((uint)(CONCAT44(uStack_230,_nStack_234) >> 0x10) & 0xffff) + (uStack_230 >> 0x10);
      if (iVar45 < *height) {
        iVar45 = *height;
      }
      *height = iVar45;
      nVar105.w = nStack_234;
      nVar105.h = nStack_232;
      nVar105.x = (undefined2)uStack_230;
      nVar105.y = uStack_230._2_2_;
      atlas->custom = nVar105;
      uVar79 = 0;
      iVar45 = 0;
      iVar99 = 0;
      lVar94 = 0;
      while( true ) {
        if (((int)(float)local_3f0 <= (int)lVar94) || (pnVar61 == (nk_font_config *)0x0)) break;
        local_390 = (long)(int)lVar94;
        pnVar74 = pnVar61;
        do {
          local_3e8 = (ulong)uVar79;
          pnVar80 = (nk_tt_fontinfo *)(local_390 * 0x48 + (long)alloc[9].ptr);
          local_390 = local_390 + 1;
          pnVar86 = pnVar74->range;
          lVar94 = 0;
          local_3a0 = 0;
          while ((pnVar86[lVar94 * 2] != 0 && (pnVar86[lVar94 * 2 + 1] != 0))) {
            local_3a0 = (ulong)(((int)local_3a0 - pnVar86[lVar94 * 2]) + pnVar86[lVar94 * 2 + 1] + 1
                               );
            lVar94 = lVar94 + 1;
          }
          pfVar67 = (float *)((long)(int)uVar79 * 0x28 + (long)alloc[0xc].ptr);
          *(float **)&pnVar80[1].fontstart = pfVar67;
          iVar53 = (int)lVar94;
          pnVar80[1].loca = iVar53;
          for (lVar98 = 0; lVar94 != lVar98; lVar98 = lVar98 + 1) {
            *pfVar67 = pnVar74->size;
            fVar102 = (float)pnVar86[lVar98 * 2];
            pfVar67[1] = fVar102;
            iVar85 = pnVar86[lVar98 * 2 + 1] - (int)fVar102;
            pfVar67[4] = (float)(iVar85 + 1);
            *(void **)(pfVar67 + 6) = (void *)((long)iVar99 * 0x1c + (long)alloc[10].ptr);
            iVar99 = iVar85 + iVar99 + 1;
            pfVar67 = pfVar67 + 10;
          }
          local_398 = (nk_font_glyph *)CONCAT44(local_398._4_4_,iVar45);
          pnVar80[1].data = (uchar *)((long)iVar45 * 0x10 + (long)alloc[0xb].ptr);
          nk_tt_PackSetOversampling
                    ((nk_tt_pack_context *)local_3a8,(uint)pnVar74->oversample_h,
                     (uint)pnVar74->oversample_v);
          lVar94 = *(long *)&pnVar80[1].fontstart;
          uVar75 = 0;
          uVar77 = (ulong)(uint)pnVar80[1].loca;
          if (pnVar80[1].loca < 1) {
            uVar77 = uVar75;
          }
          local_338._0_8_ = pnVar80[1].data + 6;
          uVar84 = 0;
          for (; iVar45 = (int)uVar84, uVar75 != uVar77; uVar75 = uVar75 + 1) {
            fVar102 = *(float *)(lVar94 + uVar75 * 0x28);
            if (fVar102 <= 0.0) {
              fVar102 = -fVar102 /
                        (float)(ushort)(*(ushort *)(pnVar80->data + (long)pnVar80->head + 0x12) << 8
                                       | *(ushort *)(pnVar80->data + (long)pnVar80->head + 0x12) >>
                                         8);
            }
            else {
              fVar102 = nk_tt_ScaleForPixelHeight(pnVar80,fVar102);
            }
            lVar98 = uVar75 * 0x28 + lVar94;
            *(undefined1 *)(lVar98 + 0x20) = *(undefined1 *)(alloc + 6);
            *(undefined1 *)(lVar98 + 0x21) = *(undefined1 *)((long)alloc + 0x34);
            psVar78 = (short *)((long)iVar45 * 0x10 + local_338._0_8_);
            for (lVar95 = 0; lVar95 < *(int *)(lVar98 + 0x10); lVar95 = lVar95 + 1) {
              if (*(int *)(lVar98 + 4) == 0) {
                iVar85 = *(int *)(*(long *)(lVar98 + 8) + lVar95 * 4);
              }
              else {
                iVar85 = *(int *)(lVar98 + 4) + (int)lVar95;
              }
              iVar85 = nk_tt_FindGlyphIndex(pnVar80,iVar85);
              uVar79 = alloc[6].id;
              uVar92 = *(uint *)((long)alloc + 0x34);
              nk_tt_GetGlyphBitmapBoxSubpixel
                        (pnVar80,iVar85,(float)uVar79 * fVar102,(float)uVar92 * fVar102,fVar102,
                         in_XMM3._0_4_,&x0,&y0,&x1,(int *)&local_3c8);
              sVar18 = (short)*(undefined4 *)((long)alloc + 0x2c);
              psVar78[-1] = (((short)_x1 + (short)uVar79) - (short)x0) + sVar18 + -1;
              *psVar78 = ~(ushort)y0 + sVar18 + (short)uVar92 + (short)(int)local_3c8;
              psVar78 = psVar78 + 8;
            }
            uVar84 = (ulong)(uint)(iVar45 + (int)lVar95);
          }
          nk_rp_pack_rects((nk_rp_context *)local_3a8->ptr,(nk_rp_rect *)pnVar80[1].data,iVar45);
          if (iVar45 < 1) {
            uVar84 = 0;
          }
          for (lVar94 = 0; uVar84 * 0x10 != lVar94; lVar94 = lVar94 + 0x10) {
            puVar13 = pnVar80[1].data;
            if (*(int *)(puVar13 + lVar94 + 0xc) != 0) {
              iVar45 = (uint)*(ushort *)(puVar13 + lVar94 + 6) +
                       (uint)*(ushort *)(puVar13 + lVar94 + 10);
              if ((int)((uint)*(ushort *)(puVar13 + lVar94 + 6) +
                       (uint)*(ushort *)(puVar13 + lVar94 + 10)) < *height) {
                iVar45 = *height;
              }
              *height = iVar45;
            }
          }
          uVar79 = (int)local_3e8 + iVar53;
          iVar45 = (int)local_3a0 + (int)local_398;
          pnVar74 = pnVar74->n;
        } while (pnVar74 != pnVar61);
        pnVar61 = pnVar61->next;
        uVar79 = (int)local_3e8 + iVar53;
        lVar94 = local_390;
      }
      if (iVar45 != iVar93) {
        __assert_fail("rect_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31c9,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if (iVar99 != iVar93) {
        __assert_fail("char_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31ca,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if (uVar79 != uVar91) {
        __assert_fail("range_n == total_range_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31cb,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      nVar46 = nk_round_up_pow2(*height);
      *height = nVar46;
      pvVar73 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(long)(int)nVar46 * (long)*width)
      ;
      atlas->pixel = pvVar73;
      if (pvVar73 == (void *)0x0) {
        __assert_fail("atlas->pixel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x356b,
                      "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                     );
      }
      iVar93 = *width;
      lVar94 = (long)iVar93;
      if (lVar94 == 0) {
        __assert_fail("width",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31dc,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      fVar102 = (float)*height;
      local_3dc = fVar102;
      if (fVar102 == 0.0) {
        __assert_fail("height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31dd,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (atlas->config == (nk_font_config *)0x0) {
        __assert_fail("config_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31de,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (alloc == (nk_handle *)0x0) {
        __assert_fail("baker",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31df,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      local_3d8 = atlas->font_num;
      if (local_3d8 == 0) {
        __assert_fail("font_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31e0,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (atlas->glyph_count == 0) {
        __assert_fail("glyphs_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x31e1,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      local_398 = atlas->glyphs;
      if (local_398 != (nk_font_glyph *)0x0) {
        local_3d0 = atlas->config;
        local_2e0 = lVar94;
        nk_zero(pvVar73,(int)fVar102 * lVar94);
        alloc[7].ptr = pvVar73;
        *(float *)((long)alloc + 0x24) = fVar102;
        pnVar61 = local_3d0;
        lVar94 = 0;
        while (((int)lVar94 < local_3d8 && (pnVar61 != (nk_font_config *)0x0))) {
          local_2d0 = (long)(int)lVar94;
          local_320 = pnVar61;
          do {
            pvVar73 = alloc[9].ptr;
            lVar98 = local_2d0 * 0x48;
            local_2d0 = local_2d0 + 1;
            local_3c0 = (nk_tt_fontinfo *)((long)pvVar73 + lVar98);
            local_2d8 = pnVar61;
            nk_tt_PackSetOversampling
                      ((nk_tt_pack_context *)local_3a8,(uint)pnVar61->oversample_h,
                       (uint)pnVar61->oversample_v);
            auVar123 = (undefined1  [16])0x0;
            lVar94 = *(long *)((long)pvVar73 + lVar98 + 0x30);
            local_310 = *(long *)((long)pvVar73 + lVar98 + 0x38);
            uVar91 = *(uint *)((long)pvVar73 + lVar98 + 0x40);
            local_268 = alloc[6];
            uStack_260 = 0;
            if ((int)uVar91 < 1) {
              uVar91 = 0;
            }
            local_2c8 = (ulong)uVar91;
            lVar98 = 0;
            local_308 = lVar94;
            for (uVar77 = 0; uVar77 != local_2c8; uVar77 = uVar77 + 1) {
              fVar102 = *(float *)(local_310 + uVar77 * 0x28);
              if (fVar102 <= 0.0) {
                uStack_2f4 = 0x80000000;
                uStack_2f0 = 0x80000000;
                uStack_2ec = 0x80000000;
                local_2f8 = -fVar102 /
                            (float)(ushort)(*(ushort *)
                                             (local_3c0->data + (long)local_3c0->head + 0x12) << 8 |
                                           *(ushort *)
                                            (local_3c0->data + (long)local_3c0->head + 0x12) >> 8);
              }
              else {
                local_2f8 = nk_tt_ScaleForPixelHeight(local_3c0,fVar102);
                auVar123 = (undefined1  [16])0x0;
                uStack_2f4 = extraout_XMM0_Db;
                uStack_2f0 = extraout_XMM0_Dc;
                uStack_2ec = extraout_XMM0_Dd;
              }
              lVar81 = uVar77 * 0x28 + local_310;
              uVar75 = *(ulong *)(lVar81 + 0x20);
              auVar36._8_6_ = 0;
              auVar36._0_8_ = uVar75;
              auVar36[0xe] = (char)(uVar75 >> 0x38);
              auVar38._8_4_ = 0;
              auVar38._0_8_ = uVar75;
              auVar38[0xc] = (char)(uVar75 >> 0x30);
              auVar38._13_2_ = auVar36._13_2_;
              auVar39._8_4_ = 0;
              auVar39._0_8_ = uVar75;
              auVar39._12_3_ = auVar38._12_3_;
              auVar40._8_2_ = 0;
              auVar40._0_8_ = uVar75;
              auVar40[10] = (char)(uVar75 >> 0x28);
              auVar40._11_4_ = auVar39._11_4_;
              auVar41._8_2_ = 0;
              auVar41._0_8_ = uVar75;
              auVar41._10_5_ = auVar40._10_5_;
              auVar42[8] = (char)(uVar75 >> 0x20);
              auVar42._0_8_ = uVar75;
              auVar42._9_6_ = auVar41._9_6_;
              cVar114 = (char)(uVar75 >> 0x18);
              Var29 = CONCAT91((unkuint9)auVar42._8_7_ << 8,cVar114);
              auVar35[10] = 0;
              auVar35._0_10_ = Var29;
              cVar113 = (char)(uVar75 >> 0x10);
              auVar28._1_11_ = auVar35 << 8;
              auVar28[0] = cVar113;
              auVar34[0xc] = 0;
              auVar34._0_12_ = auVar28;
              cVar112 = (char)(uVar75 >> 8);
              auVar27._1_13_ = auVar34 << 8;
              auVar27[0] = cVar112;
              bVar101 = (byte)uVar75;
              uVar135 = CONCAT11(0,bVar101);
              auVar106._2_14_ = auVar27;
              sVar118 = 1 - auVar27._0_2_;
              sVar18 = -auVar28._0_2_;
              uVar66 = (ushort)Var29;
              sVar19 = -uVar66;
              auVar37._10_2_ = 0;
              auVar37._0_10_ = auVar106._0_10_;
              auVar37._12_2_ = uVar66;
              uVar43 = CONCAT42(auVar37._10_4_,auVar28._0_2_);
              auVar30._2_10_ = (unkuint10)uVar43 << 0x10;
              auVar30._0_2_ = auVar27._0_2_;
              auVar129._0_4_ = CONCAT22(0,uVar135);
              auVar129._4_12_ = auVar30;
              alloc[6] = auVar129._0_8_;
              auVar107._0_4_ = (float)auVar129._0_4_;
              auVar107._4_4_ = (float)auVar30._0_4_;
              auVar107._8_4_ = (float)(int)uVar43;
              auVar107._12_4_ = (float)uVar66;
              auVar129 = divps(_DAT_00157160,auVar107);
              auVar130[0] = -(bVar101 == 0);
              auVar130[1] = -(bVar101 == 0);
              auVar130[2] = -(bVar101 == 0);
              auVar130[3] = -(bVar101 == 0);
              auVar130[4] = -(cVar112 == '\0');
              auVar130[5] = -(cVar112 == '\0');
              auVar130[6] = -(cVar112 == '\0');
              auVar130[7] = -(cVar112 == '\0');
              auVar130[8] = -(cVar113 == auVar123[8]);
              auVar130[9] = -(cVar113 == auVar123[9]);
              auVar130[10] = -(cVar113 == auVar123[10]);
              auVar130[0xb] = -(cVar113 == auVar123[0xb]);
              auVar130[0xc] = -(cVar114 == auVar123[0xc]);
              auVar130[0xd] = -(cVar114 == auVar123[0xd]);
              auVar130[0xe] = -(cVar114 == auVar123[0xe]);
              auVar130[0xf] = -(cVar114 == '\0');
              Var33 = CONCAT64(CONCAT42(CONCAT22(sVar19,sVar19),sVar18),CONCAT22(sVar18,sVar19));
              auVar31._4_8_ = (long)((unkuint10)Var33 >> 0x10);
              auVar31._2_2_ = sVar118;
              auVar31._0_2_ = sVar118;
              auVar116._0_4_ = (float)(int)(short)(1 - uVar135);
              auVar116._4_4_ = (float)(auVar31._0_4_ >> 0x10);
              auVar116._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
              auVar116._12_4_ = (float)(int)sVar19;
              auVar108._0_4_ = auVar107._0_4_ + auVar107._0_4_;
              auVar108._4_4_ = auVar107._4_4_ + auVar107._4_4_;
              auVar108._8_4_ = auVar107._8_4_ + auVar107._8_4_;
              auVar108._12_4_ = auVar107._12_4_ + auVar107._12_4_;
              local_248 = divps(auVar116,auVar108);
              local_248 = ~auVar130 & local_248;
              lVar98 = (long)(int)lVar98;
              lVar95 = 0;
              local_300 = lVar81;
              local_2c0 = uVar77;
              local_258 = auVar129;
LAB_00125d76:
              pnVar80 = local_3c0;
              fVar102 = auVar129._0_4_;
              if (lVar95 < *(int *)(lVar81 + 0x10)) {
                if (*(int *)(lVar94 + 0xc + lVar98 * 0x10) != 0) {
                  if (*(int *)(lVar81 + 4) == 0) {
                    iVar93 = *(int *)(*(long *)(lVar81 + 8) + lVar95 * 4);
                  }
                  else {
                    iVar93 = *(int *)(lVar81 + 4) + (int)lVar95;
                  }
                  lVar94 = lVar98 * 0x10 + lVar94;
                  local_288 = (undefined4 *)(lVar95 * 0x1c + *(long *)(lVar81 + 0x18));
                  local_3f0 = lVar95;
                  local_280 = lVar98;
                  iVar45 = nk_tt_FindGlyphIndex(local_3c0,iVar93);
                  uVar4 = *(undefined8 *)(lVar94 + 4);
                  auVar123 = pshuflw(ZEXT416(*(uint *)((long)alloc + 0x2c)),
                                     ZEXT416(*(uint *)((long)alloc + 0x2c)),0);
                  uVar121 = (short)uVar4 - auVar123._0_2_;
                  uVar125 = (short)((ulong)uVar4 >> 0x10) - auVar123._2_2_;
                  uVar119 = (short)((ulong)uVar4 >> 0x20) + auVar123._4_2_;
                  uVar120 = (short)((ulong)uVar4 >> 0x30) + auVar123._6_2_;
                  *(ulong *)(lVar94 + 4) =
                       CONCAT44(CONCAT22(uVar120,uVar119),CONCAT22(uVar125,uVar121));
                  puVar13 = pnVar80->data;
                  uVar66 = *(ushort *)(puVar13 + (long)pnVar80->hhea + 0x22) << 8 |
                           *(ushort *)(puVar13 + (long)pnVar80->hhea + 0x22) >> 8;
                  iVar93 = pnVar80->hmtx;
                  lVar98 = (ulong)uVar66 * 4 + (long)iVar93 + -4;
                  lVar95 = (ulong)uVar66 * 4 + (long)iVar93 + -3;
                  if (iVar45 < (int)(uint)uVar66) {
                    lVar98 = (long)(iVar45 * 4) + (long)iVar93;
                    lVar95 = (long)(iVar45 * 4) + 1 + (long)iVar93;
                  }
                  local_380 = (uint)puVar13[lVar98];
                  local_384 = (uint)puVar13[lVar95];
                  uVar91 = alloc[6].id;
                  uVar79 = *(uint *)((long)alloc + 0x34);
                  fVar103 = (float)uVar91 * local_2f8;
                  fVar115 = (float)uVar79 * local_2f8;
                  fVar104 = local_2f8;
                  nk_tt_GetGlyphBitmapBoxSubpixel
                            (pnVar80,iVar45,fVar103,fVar115,local_2f8,fVar102,&x0_1,&y0_1,&x1_1,
                             &local_270);
                  pvVar73 = alloc[7].ptr;
                  local_3d4 = alloc[5].id;
                  iVar99 = uVar121 - uVar91;
                  uVar91 = nk_tt_GetGlyphShape(pnVar80,(nk_allocator *)alloc,iVar45,
                                               (nk_tt_vertex **)&local_3c8);
                  nk_tt_GetGlyphBitmapBoxSubpixel
                            (pnVar80,iVar45,fVar103,fVar115,fVar104,fVar102,&ix0,&iy0,(int *)0x0,
                             (int *)0x0);
                  iVar45 = ix0;
                  iVar93 = iy0;
                  uVar92 = iVar99 + 1;
                  if ((uVar92 != 0) &&
                     (uVar79 = (uVar125 - uVar79) + 1, local_3b0 = (ulong)uVar79, uVar79 != 0)) {
                    iVar53 = (uint)uVar120 * local_3d4;
                    lVar98 = CONCAT44(local_3c8._4_4_,(int)local_3c8);
                    uVar75 = 0;
                    uVar77 = (ulong)uVar91;
                    if ((int)uVar91 < 1) {
                      uVar77 = uVar75;
                    }
                    uVar84 = 0;
                    for (; uVar77 * 10 - uVar75 != 0; uVar75 = uVar75 + 10) {
                      uVar84 = (ulong)((int)uVar84 +
                                      (uint)(*(char *)(lVar98 + 8 + uVar75) == '\x01'));
                    }
                    if (((int)uVar84 != 0) &&
                       (pnVar62 = (nk_tt__point *)(*(code *)alloc[1])(*alloc,(void *)0x0,uVar84 * 4)
                       , pnVar62 != (nk_tt__point *)0x0)) {
                      fVar102 = fVar115;
                      if (fVar103 <= fVar115) {
                        fVar102 = fVar103;
                      }
                      points = (nk_tt__point *)0x0;
                      iVar85 = 0;
                      iVar97 = 0;
                      iVar89 = 0;
                      local_290 = (long)pvVar73 + (long)iVar53 + (ulong)uVar119;
                      do {
                        if (iVar97 == 1) {
                          points = (nk_tt__point *)
                                   (*(code *)alloc[1])(*alloc,(void *)0x0,(long)iVar89 << 3);
                          if (points == (nk_tt__point *)0x0) {
                            (*(code *)alloc[2])(*alloc,(void *)0x0);
                            nVar87 = *alloc;
                            goto LAB_00126da9;
                          }
                        }
                        else if (iVar97 == 2) goto LAB_001261e3;
                        x0 = 0;
                        fVar104 = 0.0;
                        fVar127 = 0.0;
                        uVar91 = 0xffffffff;
                        for (lVar95 = 0; uVar77 * 10 - lVar95 != 0; lVar95 = lVar95 + 10) {
                          cVar112 = *(char *)(lVar98 + 8 + lVar95);
                          if (cVar112 == '\x03') {
                            nk_tt__tesselate_curve
                                      (points,&x0,fVar104,fVar127,
                                       (float)(int)*(short *)(lVar98 + 4 + lVar95),
                                       (float)(int)*(short *)(lVar98 + 6 + lVar95),
                                       (float)(int)*(short *)(lVar98 + lVar95),
                                       (float)(int)*(short *)(lVar98 + 2 + lVar95),
                                       (0.35 / fVar102) * (0.35 / fVar102),0);
                            auVar123 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar95)),
                                               ZEXT416(*(uint *)(lVar98 + lVar95)),0x60);
                            fVar104 = (float)(auVar123._0_4_ >> 0x10);
                            fVar127 = (float)(auVar123._4_4_ >> 0x10);
                            iVar53 = x0;
                          }
                          else if (cVar112 == '\x02') {
                            auVar123 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar95)),
                                               ZEXT416(*(uint *)(lVar98 + lVar95)),0x60);
                            fVar104 = (float)(auVar123._0_4_ >> 0x10);
                            fVar127 = (float)(auVar123._4_4_ >> 0x10);
                            iVar53 = x0 + 1;
                            if (points != (nk_tt__point *)0x0) {
                              points[x0].x = fVar104;
                              points[x0].y = fVar127;
                            }
                          }
                          else {
                            iVar53 = x0;
                            if (cVar112 == '\x01') {
                              if (-1 < (int)uVar91) {
                                (&pnVar62->x)[uVar91] = (float)(x0 - iVar85);
                              }
                              uVar91 = uVar91 + 1;
                              auVar123 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar95)),
                                                 ZEXT416(*(uint *)(lVar98 + lVar95)),0x60);
                              fVar104 = (float)(auVar123._0_4_ >> 0x10);
                              fVar127 = (float)(auVar123._4_4_ >> 0x10);
                              iVar85 = x0;
                              iVar53 = x0 + 1;
                              if (points != (nk_tt__point *)0x0) {
                                points[x0].x = fVar104;
                                points[x0].y = fVar127;
                              }
                            }
                          }
                          x0 = iVar53;
                        }
                        (&pnVar62->x)[(int)uVar91] = (float)(x0 - iVar85);
                        iVar97 = iVar97 + 1;
                        iVar89 = x0;
                      } while( true );
                    }
                  }
                  goto LAB_00126dac;
                }
                goto LAB_001272c3;
              }
            }
            alloc[6] = local_268;
            pnVar61 = local_2d8->n;
          } while (pnVar61 != local_320);
          lVar94 = local_2d0;
          pnVar61 = local_320->next;
        }
        (*(code *)alloc[2])(*alloc,alloc[8].ptr);
        (*(code *)alloc[2])(*alloc,alloc[3].ptr);
        fVar102 = (float)(int)local_2e0;
        fVar104 = (float)(int)local_3dc;
        auVar134._8_8_ = 0x3f8000003f800000;
        auVar134._0_8_ = 0x3f8000003f800000;
        auVar17._4_4_ = fVar104;
        auVar17._0_4_ = fVar102;
        auVar17._8_4_ = fVar102;
        auVar17._12_4_ = fVar104;
        auVar123 = divps(auVar134,auVar17);
        local_488 = 0;
        lVar94 = 0;
        pnVar61 = local_3d0;
        while (((int)lVar94 < local_3d8 && (pnVar61 != (nk_font_config *)0x0))) {
          pvVar73 = alloc[9].ptr;
          lVar94 = (long)(int)lVar94;
          local_3d0 = pnVar61;
          do {
            pnVar80 = (nk_tt_fontinfo *)(lVar94 * 0x48 + (long)pvVar73);
            pnVar15 = pnVar61->font;
            if (pnVar61->merge_mode == '\0') {
              puVar13 = pnVar80->data;
              lVar98 = (long)pnVar80->hhea;
              bVar101 = puVar13[lVar98 + 7];
              bVar8 = puVar13[lVar98 + 4];
              bVar9 = puVar13[lVar98 + 5];
              fVar103 = pnVar61->size;
              bVar10 = puVar13[lVar98 + 6];
              fVar115 = nk_tt_ScaleForPixelHeight(pnVar80,fVar103);
              pnVar15->ranges = pnVar61->range;
              pnVar15->height = fVar103;
              iVar93 = (uint)bVar10 * 0x100 + (uint)bVar8;
              auVar44._10_6_ = 0;
              auVar44._0_10_ = SUB1610(ZEXT116(0) << 0x38,6);
              auVar21._1_12_ = SUB1612(auVar44 << 0x30,4);
              auVar21[0] = (char)((uint)iVar93 >> 8);
              auVar21._13_3_ = 0;
              auVar20._1_14_ = SUB1614(auVar21 << 0x18,2);
              auVar20[0] = (char)iVar93;
              auVar20[0xf] = 0;
              auVar129 = ZEXT416((uint)bVar101 * 0x10000 + (uint)bVar9) | auVar20 << 8;
              pnVar15->ascent = fVar115 * (float)(int)auVar129._0_2_;
              pnVar15->descent = fVar115 * (float)(int)auVar129._2_2_;
              pnVar15->glyph_offset = local_488;
            }
            lVar94 = lVar94 + 1;
            uVar91 = pnVar80[1].loca;
            iVar93 = 0;
            for (uVar77 = 0; uVar77 != uVar91; uVar77 = uVar77 + 1) {
              lVar98 = *(long *)&pnVar80[1].fontstart + uVar77 * 0x28;
              uVar79 = *(uint *)(*(long *)&pnVar80[1].fontstart + 0x10 + uVar77 * 0x28);
              uVar84 = 0;
              uVar75 = (ulong)uVar79;
              if ((int)uVar79 < 1) {
                uVar75 = uVar84;
              }
              iVar45 = 0;
              for (; uVar75 * 0x1c - uVar84 != 0; uVar84 = uVar84 + 0x1c) {
                lVar95 = *(long *)(lVar98 + 0x18);
                uVar66 = *(ushort *)(lVar95 + 2 + uVar84);
                uVar119 = *(ushort *)(lVar95 + 4 + uVar84);
                if (*(ushort *)(lVar95 + uVar84) == 0 && uVar119 == 0) {
                  fVar103 = 0.0;
                  if (uVar66 != 0) goto LAB_00127574;
                  if (*(short *)(lVar95 + 6 + uVar84) != 0) {
                    uVar66 = 0;
                    goto LAB_00127574;
                  }
                }
                else {
                  fVar103 = (float)uVar119;
LAB_00127574:
                  fVar132 = *(float *)(lVar95 + 8 + uVar84) + 0.0;
                  fVar115 = *(float *)(lVar95 + 0xc + uVar84);
                  fVar131 = *(float *)(lVar95 + 0x14 + uVar84) + 0.0;
                  fVar127 = *(float *)(lVar95 + 0x18 + uVar84);
                  fVar126 = (float)*(ushort *)(lVar95 + uVar84) * auVar123._0_4_;
                  fVar122 = (float)uVar66 * auVar123._4_4_;
                  fVar103 = fVar103 * auVar123._8_4_;
                  fVar133 = (float)*(ushort *)(lVar95 + 6 + uVar84) * auVar123._12_4_;
                  uVar79 = pnVar15->glyph_offset + iVar93 + pnVar15->glyph_count;
                  local_398[uVar79].codepoint = *(int *)(lVar98 + 4) + iVar45;
                  local_398[uVar79].x0 = fVar132;
                  local_398[uVar79].x1 = fVar131;
                  fVar128 = pnVar15->ascent + 0.5;
                  fVar115 = fVar115 + 0.0 + fVar128;
                  local_398[uVar79].y0 = fVar115;
                  fVar128 = fVar128 + fVar127 + 0.0;
                  local_398[uVar79].y1 = fVar128;
                  local_398[uVar79].w = (fVar131 - fVar132) + 0.5;
                  local_398[uVar79].h = fVar128 - fVar115;
                  if (pnVar61->coord_type == NK_COORD_PIXEL) {
                    fVar126 = fVar126 * fVar102;
                    fVar122 = fVar122 * fVar104;
                    fVar103 = fVar103 * fVar102;
                    fVar133 = fVar133 * fVar104;
                  }
                  pfVar67 = &local_398[uVar79].u0;
                  *pfVar67 = fVar126;
                  pfVar67[1] = fVar122;
                  pfVar67[2] = fVar103;
                  pfVar67[3] = fVar133;
                  fVar103 = *(float *)(lVar95 + 0x10 + uVar84) + (pnVar61->spacing).x;
                  local_398[uVar79].xadvance = fVar103;
                  if (pnVar61->pixel_snap != '\0') {
                    local_398[uVar79].xadvance = (float)(int)(fVar103 + 0.5);
                  }
                  iVar93 = iVar93 + 1;
                }
                iVar45 = iVar45 + 1;
              }
            }
            pnVar15->glyph_count = pnVar15->glyph_count + iVar93;
            local_488 = local_488 + iVar93;
            pnVar61 = pnVar61->n;
          } while (pnVar61 != local_3d0);
          pnVar61 = local_3d0->next;
        }
        pvVar73 = atlas->pixel;
        if (pvVar73 == (void *)0x0) {
          __assert_fail("img_memory",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3249,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        iVar93 = *width;
        if (iVar93 == 0) {
          __assert_fail("img_width",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x324a,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        if (*height == 0) {
          __assert_fail("img_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x324b,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
      }
      iVar45 = (SUB84(atlas->custom,0) >> 0x10) * iVar93 + (int)(atlas->custom).x;
      lVar94 = 0;
      for (iVar99 = 0; iVar99 != 0x1b; iVar99 = iVar99 + 1) {
        for (lVar98 = 0; lVar98 != 0x5a; lVar98 = lVar98 + 1) {
          cVar112 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                    [(int)lVar94 + lVar98];
          lVar95 = (long)(iVar45 + (int)lVar98);
          *(char *)((long)pvVar73 + lVar95) = -(cVar112 == '.');
          *(char *)((long)pvVar73 + lVar95 + 0x5b) = -(cVar112 == 'X');
        }
        iVar45 = iVar45 + iVar93;
        lVar94 = (long)(int)lVar94 + 0x5a;
      }
      iVar93 = *width;
      if (local_388 == NK_FONT_ATLAS_RGBA32) {
        pvVar73 = (*(atlas->temporary).alloc)
                            ((atlas->temporary).userdata,(void *)0x0,(long)(iVar93 * *height * 4));
        if (pvVar73 == (void *)0x0) {
          __assert_fail("img_rgba",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3579,
                        "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                       );
        }
        pvVar60 = atlas->pixel;
        if (pvVar60 == (void *)0x0) {
          __assert_fail("in_memory",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3264,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        if (*width == 0) {
          __assert_fail("img_width",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3265,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        if (*height == 0) {
          __assert_fail("img_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3266,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        lVar94 = 0;
        for (iVar93 = *height * *width; 0 < iVar93; iVar93 = iVar93 + -1) {
          *(uint *)((long)pvVar73 + lVar94 * 4) =
               (uint)*(byte *)((long)pvVar60 + lVar94) << 0x18 | 0xffffff;
          lVar94 = lVar94 + 1;
        }
        (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar60);
        atlas->pixel = pvVar73;
        iVar93 = *width;
      }
      atlas->tex_width = iVar93;
      atlas->tex_height = *height;
      pnVar56 = (nk_font *)&atlas->fonts;
      while( true ) {
        pnVar56 = pnVar56->next;
        if (pnVar56 == (nk_font *)0x0) {
          nVar105 = atlas->custom;
          auVar111._8_4_ = 0;
          auVar111._0_2_ = nVar105.x;
          auVar111._2_2_ = nVar105.y;
          auVar111._4_2_ = nVar105.w;
          auVar111._6_2_ = nVar105.h;
          auVar111._12_2_ = nVar105.h;
          auVar111._14_2_ = nVar105.h;
          auVar110._12_4_ = auVar111._12_4_;
          auVar110._8_2_ = 0;
          auVar110._0_2_ = nVar105.x;
          auVar110._2_2_ = nVar105.y;
          auVar110._4_2_ = nVar105.w;
          auVar110._6_2_ = nVar105.h;
          auVar110._10_2_ = nVar105.w;
          auVar109._10_6_ = auVar110._10_6_;
          auVar109._8_2_ = nVar105.w;
          auVar109._0_2_ = nVar105.x;
          auVar109._2_2_ = nVar105.y;
          auVar109._4_2_ = nVar105.w;
          auVar109._6_2_ = nVar105.h;
          auVar32._4_8_ = auVar109._8_8_;
          auVar32._2_2_ = nVar105.y;
          auVar32._0_2_ = nVar105.y;
          pnVar71 = nk_font_atlas_bake::nk_cursor_data[0] + 1;
          for (lVar94 = 0x60; lVar94 != 0x178; lVar94 = lVar94 + 0x28) {
            *(short *)((long)atlas->cursors[0].img.region + lVar94 + -100) = (short)*width;
            *(short *)((long)atlas->cursors[0].img.region + lVar94 + -0x62) = (short)*height;
            auVar117._0_4_ = (int)(pnVar71[-1].x + (float)(int)nVar105.x);
            auVar117._4_4_ = (int)(pnVar71[-1].y + (float)(auVar32._0_4_ >> 0x10));
            auVar117._8_4_ = (int)(*pnVar71).x;
            auVar117._12_4_ = (int)(*pnVar71).y;
            auVar123 = pshuflw(auVar117,auVar117,0xe8);
            auVar123 = pshufhw(auVar123,auVar123,0xe8);
            *(ulong *)((long)atlas->cursors[0].img.region + lVar94 + -0x60) =
                 CONCAT44(auVar123._8_4_,auVar123._0_4_);
            nVar26 = pnVar71[1];
            pnVar2 = (nk_vec2 *)((long)(&atlas->cursors[0].img + -3) + lVar94);
            *pnVar2 = *pnVar71;
            pnVar2[1] = nVar26;
            pnVar71 = pnVar71 + 3;
          }
          (*(atlas->temporary).free)((atlas->temporary).userdata,local_318);
          return atlas->pixel;
        }
        pnVar57 = atlas->glyphs;
        if (pnVar57 == (nk_font_glyph *)0x0) break;
        pnVar61 = pnVar56->config;
        pnVar15 = pnVar61->font;
        if (pnVar15 == (nk_baked_font *)0x0) {
          __assert_fail("baked_font",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x32d4,
                        "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                       );
        }
        fVar102 = pnVar61->size;
        unicode = pnVar61->fallback_glyph;
        uVar22 = pnVar15->height;
        uVar23 = pnVar15->ascent;
        uVar24 = pnVar15->descent;
        uVar25 = pnVar15->glyph_offset;
        local_228 = *(undefined8 *)&pnVar15->glyph_count;
        pnStack_220 = pnVar15->ranges;
        pnVar56->fallback = (nk_font_glyph *)0x0;
        (pnVar56->info).height = (float)uVar22;
        (pnVar56->info).ascent = (float)uVar23;
        (pnVar56->info).descent = (float)uVar24;
        (pnVar56->info).glyph_offset = uVar25;
        *(undefined8 *)&(pnVar56->info).glyph_count = local_228;
        (pnVar56->info).ranges = pnStack_220;
        pnVar56->scale = fVar102 / (pnVar56->info).height;
        pnVar56->glyphs = pnVar57 + pnVar15->glyph_offset;
        (pnVar56->texture).ptr = (void *)0x0;
        pnVar56->fallback_codepoint = unicode;
        x0 = uVar22;
        _nStack_234 = uVar23;
        uStack_230 = uVar24;
        iStack_22c = uVar25;
        pnVar57 = nk_font_find_glyph(pnVar56,unicode);
        pnVar56->fallback = pnVar57;
        (pnVar56->handle).height = (pnVar56->info).height * pnVar56->scale;
        (pnVar56->handle).width = nk_font_text_width;
        (pnVar56->handle).userdata.ptr = pnVar56;
        (pnVar56->handle).query = nk_font_query_font_glyph;
        (pnVar56->handle).texture = pnVar56->texture;
      }
      __assert_fail("glyphs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x32d3,
                    "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                   );
    }
    lVar94 = (long)(int)lVar94;
    pnVar58 = pnVar74;
    do {
      lVar98 = lVar94 * 0x48;
      data = (nk_byte *)pnVar58->ttf_blob;
      *(nk_byte **)((long)pvVar73 + lVar98) = data;
      *(undefined4 *)((long)pvVar73 + lVar98 + 8) = 0;
      nVar46 = nk_tt__find_table(data,0x160aac,(char *)pnVar74);
      nVar47 = nk_tt__find_table(data,0x160ab1,tag);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x10) = nVar47;
      nVar48 = nk_tt__find_table(data,0x160ab6,tag_00);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x14) = nVar48;
      nVar49 = nk_tt__find_table(data,0x160abb,tag_01);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x18) = nVar49;
      nVar50 = nk_tt__find_table(data,0x160ac0,tag_02);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x1c) = nVar50;
      nVar51 = nk_tt__find_table(data,0x160ac5,tag_03);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x20) = nVar51;
      nVar52 = nk_tt__find_table(data,0x160aca,tag_04);
      *(nk_uint *)((long)pvVar73 + lVar98 + 0x24) = nVar52;
      if ((((nVar46 == 0) || (nVar47 == 0)) || (nVar48 == 0)) ||
         (((nVar49 == 0 || (nVar50 == 0)) || (nVar51 == 0)))) {
LAB_00125543:
        (*(atlas->temporary).free)((atlas->temporary).userdata,local_318);
        if (atlas->glyphs != (nk_font_glyph *)0x0) {
          (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
          atlas->glyphs = (nk_font_glyph *)0x0;
        }
        if (atlas->pixel != (void *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
          atlas->pixel = (void *)0x0;
        }
        return (void *)0x0;
      }
      nVar47 = nk_tt__find_table(data,0x160acf,tag_05);
      if (nVar47 == 0) {
        uVar79 = 0xffff;
      }
      else {
        uVar79 = (uint)(ushort)(*(ushort *)(data + (ulong)nVar47 + 4) << 8 |
                               *(ushort *)(data + (ulong)nVar47 + 4) >> 8);
      }
      *(uint *)((long)pvVar73 + lVar98 + 0xc) = uVar79;
      uVar66 = *(ushort *)(data + (ulong)nVar46 + 2);
      *(undefined4 *)((long)pvVar73 + lVar98 + 0x28) = 0;
      lVar94 = lVar94 + 1;
      uVar77 = (ulong)(ushort)(uVar66 << 8 | uVar66 >> 8);
      uVar79 = nVar46 + 4;
      iVar45 = 0;
      while (bVar100 = uVar77 != 0, uVar77 = uVar77 - 1, bVar100) {
        uVar66 = *(ushort *)(data + uVar79) << 8 | *(ushort *)(data + uVar79) >> 8;
        if ((uVar66 == 0) ||
           ((uVar66 == 3 &&
            ((uVar66 = *(ushort *)(data + (ulong)uVar79 + 2) << 8 |
                       *(ushort *)(data + (ulong)uVar79 + 2) >> 8, uVar66 == 10 || (uVar66 == 1)))))
           ) {
          nVar47 = nk_ttULONG(data + (ulong)uVar79 + 4);
          iVar45 = nVar47 + nVar46;
          *(int *)((long)pvVar73 + lVar98 + 0x28) = iVar45;
        }
        uVar79 = uVar79 + 8;
      }
      if (iVar45 == 0) goto LAB_00125543;
      *(uint *)((long)pvVar73 + lVar98 + 0x2c) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)nVar48 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)nVar48 + 0x32) >> 8);
      pnVar58 = pnVar58->n;
    } while (pnVar58 != pnVar74);
    pnVar74 = pnVar74->next;
  } while( true );
LAB_001261e3:
  if (points != (nk_tt__point *)0x0) {
    iVar53 = 0;
    for (uVar77 = 0; uVar84 != uVar77; uVar77 = uVar77 + 1) {
      iVar53 = iVar53 + (int)(&pnVar62->x)[uVar77];
    }
    local_3b8 = points;
    p = (nk_tt__edge *)(*(code *)alloc[1])(*alloc,(void *)0x0,(long)(iVar53 + 1) * 0x14);
    if (p != (nk_tt__edge *)0x0) {
      iVar53 = 0;
      iVar85 = 0;
      for (uVar77 = 0; uVar77 != uVar84; uVar77 = uVar77 + 1) {
        fVar102 = (&pnVar62->x)[uVar77];
        uVar76 = (ulong)((int)fVar102 - 1);
        fVar104 = fVar102;
        for (uVar75 = 0; iVar89 = (int)uVar76, (long)uVar75 < (long)(int)fVar104;
            uVar75 = uVar75 + 1) {
          fVar127 = local_3b8[(long)iVar53 + (long)iVar89].y;
          fVar126 = local_3b8[(long)iVar53 + uVar75].y;
          if ((fVar127 != fVar126) || (NAN(fVar127) || NAN(fVar126))) {
            iVar90 = (int)uVar75;
            iVar97 = iVar89;
            if (fVar127 <= fVar126) {
              iVar97 = iVar90;
              iVar90 = iVar89;
            }
            p[iVar85].invert = (uint)(fVar126 < fVar127);
            nVar5 = local_3b8[(long)iVar53 + (long)iVar97];
            nVar6 = local_3b8[(long)iVar53 + (long)iVar90];
            pnVar63 = p + iVar85;
            pnVar63->x0 = nVar5.x * fVar103 + 0.0;
            pnVar63->y0 = nVar5.y * -fVar115 + 0.0;
            pnVar63->x1 = nVar6.x * fVar103 + 0.0;
            pnVar63->y1 = nVar6.y * -fVar115 + 0.0;
            iVar85 = iVar85 + 1;
            fVar104 = (&pnVar62->x)[uVar77];
          }
          uVar76 = uVar75 & 0xffffffff;
        }
        iVar53 = (int)fVar102 + iVar53;
      }
      nk_tt__sort_edges_quicksort(p,iVar85);
      pnVar63 = p;
      for (uVar77 = 1; (long)uVar77 < (long)iVar85; uVar77 = uVar77 + 1) {
        uVar3 = p[uVar77].x0;
        uVar7 = p[uVar77].y0;
        uStack_230 = p[uVar77].invert;
        uVar12 = p[uVar77].x1;
        uVar16 = p[uVar77].y1;
        pnVar83 = pnVar63;
        for (uVar75 = uVar77; 0 < (long)uVar75; uVar75 = uVar75 - 1) {
          if (pnVar83->y0 <= (float)uVar7) goto LAB_001263ad;
          pnVar83[1].invert = pnVar83->invert;
          fVar102 = pnVar83->y0;
          fVar104 = pnVar83->x1;
          fVar103 = pnVar83->y1;
          pnVar83[1].x0 = pnVar83->x0;
          pnVar83[1].y0 = fVar102;
          pnVar83[1].x1 = fVar104;
          pnVar83[1].y1 = fVar103;
          pnVar83 = pnVar83 + -1;
        }
        uVar75 = 0;
LAB_001263ad:
        iVar53 = (int)uVar75;
        if (uVar77 != (uVar75 & 0xffffffff)) {
          p[iVar53].x0 = (float)uVar3;
          p[iVar53].y0 = (float)uVar7;
          p[iVar53].x1 = (float)uVar12;
          p[iVar53].y1 = (float)uVar16;
          p[iVar53].invert = uStack_230;
        }
        pnVar63 = pnVar63 + 1;
        x0 = uVar12;
        _nStack_234 = uVar16;
      }
      _x1 = (nk_tt__active_edge *)0x0;
      nk_zero(&y0,0x30);
      local_358 = alloc[2];
      _y0 = *alloc;
      nStack_360 = alloc[1];
      pfVar67 = (float *)&x0;
      if (0x40 < (int)uVar92) {
        pfVar67 = (float *)(*(code *)alloc[1])(*alloc,(void *)0x0,(ulong)uVar92 * 8 + 4);
      }
      local_2b0 = (long)(int)uVar92;
      scanline = pfVar67 + local_2b0;
      p[iVar85].y0 = (float)(iVar93 + (int)local_3b0) + 1.0;
      local_3a0 = CONCAT44(local_3a0._4_4_,(float)iVar45);
      local_298 = local_2b0 * 4;
      local_3e8 = CONCAT44(local_3e8._4_4_,(float)(int)uVar92);
      local_2a0 = (long)(iVar99 + 2) << 2;
      uVar77 = 0;
      uVar91 = 0;
      if (0 < (int)uVar92) {
        uVar91 = uVar92;
      }
      local_2b8 = 0;
      if (0 < local_2b0) {
        local_2b8 = local_2b0;
      }
      uVar75 = local_3b0 & 0xffffffff;
      if ((int)local_3b0 < 1) {
        uVar75 = uVar77;
      }
      iVar45 = 0;
      local_3b0 = uVar75;
      local_2a8 = p;
      while (pnVar63 = local_2a8, puVar64 = local_350, iVar45 != (int)local_3b0) {
        fVar102 = (float)iVar93;
        fVar104 = fVar102 + 1.0;
        local_37c = iVar45;
        nk_memset(pfVar67,(int)local_298,uVar75);
        nk_memset(scanline,(int)local_2a0,size);
        pnVar69 = (nk_tt__active_edge *)&x1;
        while (pnVar68 = pnVar69, pnVar69 = pnVar68->next, pnVar69 != (nk_tt__active_edge *)0x0) {
          if (pnVar69->ey <= fVar102) {
            pnVar68->next = pnVar69->next;
            if ((pnVar69->direction == 0.0) && (!NAN(pnVar69->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                            ,0x2e23,
                            "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                           );
            }
            pnVar69->direction = 0.0;
            pnVar69->next = local_348;
            local_348 = pnVar69;
            pnVar69 = pnVar68;
          }
        }
        local_278 = uVar77;
        pnVar69 = _x1;
        for (; pnVar68 = local_348, fVar103 = p->y0, fVar103 <= fVar104; p = p + 1) {
          fVar115 = p->y1;
          if ((fVar103 == fVar115) && (!NAN(fVar103) && !NAN(fVar115))) goto LAB_00126721;
          if (local_348 == (nk_tt__active_edge *)0x0) {
            if (local_340 == 0) {
              puVar64 = (undefined8 *)(*(code *)nStack_360)(_y0,(void *)0x0,0x6408);
              if (puVar64 != (undefined8 *)0x0) {
                *puVar64 = local_350;
                local_350 = puVar64;
                local_340 = 799;
                fVar103 = p->y0;
                fVar115 = p->y1;
                goto LAB_00126689;
              }
            }
            else {
              local_340 = local_340 + -1;
              if (local_350 != (undefined8 *)0x0) {
LAB_00126689:
                pnVar68 = (nk_tt__active_edge *)(local_350 + (long)local_340 * 4);
                goto LAB_00126693;
              }
            }
          }
          else {
            local_348 = local_348->next;
LAB_00126693:
            fVar127 = p->x0;
            fVar126 = (p->x1 - fVar127) / (fVar115 - fVar103);
            pnVar68->fdx = fVar126;
            pnVar68->fdy = (float)(-(uint)(fVar126 != 0.0) & (uint)(1.0 / fVar126));
            pnVar68->fx = ((fVar102 - fVar103) * fVar126 + fVar127) - (float)local_3a0;
            pnVar68->direction = *(float *)(&DAT_001574e0 + (ulong)(p->invert == 0) * 4);
            pnVar68->sy = fVar103;
            pnVar68->ey = fVar115;
            pnVar68->next = (nk_tt__active_edge *)0x0;
            if (fVar115 < fVar102) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                            ,0x2e30,
                            "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                           );
            }
            pnVar68->next = pnVar69;
            pnVar69 = pnVar68;
          }
LAB_00126721:
        }
        _x1 = pnVar69;
        if (pnVar69 != (nk_tt__active_edge *)0x0) {
          for (; pnVar69 != (nk_tt__active_edge *)0x0; pnVar69 = pnVar69->next) {
            fVar103 = pnVar69->ey;
            if (fVar103 < fVar102) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                            ,0x2d66,
                            "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                           );
            }
            fVar115 = pnVar69->fx;
            fVar127 = pnVar69->fdx;
            if ((fVar127 != 0.0) || (NAN(fVar127))) {
              fVar126 = pnVar69->sy;
              if (fVar104 < fVar126) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                              ,0x2d78,
                              "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                             );
              }
              fVar133 = fVar127 + fVar115;
              fVar122 = (float)(~-(uint)(fVar102 < fVar126) & (uint)fVar115 |
                               (uint)((fVar126 - fVar102) * fVar127 + fVar115) &
                               -(uint)(fVar102 < fVar126));
              if ((((fVar122 < 0.0) ||
                   (fVar132 = (float)(~-(uint)(fVar103 < fVar104) & (uint)fVar133 |
                                     (uint)((fVar103 - fVar102) * fVar127 + fVar115) &
                                     -(uint)(fVar103 < fVar104)), fVar132 < 0.0)) ||
                  ((float)local_3e8 <= fVar122)) || ((float)local_3e8 <= fVar132)) {
                local_338 = ZEXT416((uint)fVar115);
                local_390 = CONCAT44(local_390._4_4_,fVar127);
                uVar79 = 0;
                while (uVar91 != uVar79) {
                  fVar103 = (float)(int)uVar79;
                  fVar122 = (float)(int)(uVar79 + 1);
                  fVar126 = (fVar103 - fVar115) / fVar127 + fVar102;
                  fVar127 = ((fVar103 + 1.0) - fVar115) / fVar127 + fVar102;
                  if ((fVar103 <= fVar115) || (fVar133 <= fVar122)) {
                    if ((fVar103 <= fVar133) || (fVar115 <= fVar122)) {
                      fVar132 = fVar102;
                      if (((fVar103 <= fVar115) || (fVar133 <= fVar103)) &&
                         ((fVar103 <= fVar133 || (fVar115 <= fVar103)))) {
                        fVar126 = fVar102;
                        if (((fVar115 < fVar122) && (fVar122 < fVar133)) ||
                           ((fVar103 = fVar115, fVar133 < fVar122 && (fVar122 < fVar115))))
                        goto LAB_00126991;
                        goto LAB_00126a54;
                      }
                    }
                    else {
                      nk_tt__handle_clipped_edge
                                (pfVar67,uVar79,pnVar69,fVar115,fVar102,fVar122,fVar127);
                      fVar115 = fVar122;
                      fVar132 = fVar127;
                    }
                    nk_tt__handle_clipped_edge
                              (pfVar67,uVar79,pnVar69,fVar115,fVar132,fVar103,fVar126);
                  }
                  else {
                    nk_tt__handle_clipped_edge
                              (pfVar67,uVar79,pnVar69,fVar115,fVar102,fVar103,fVar126);
                    fVar115 = fVar103;
LAB_00126991:
                    nk_tt__handle_clipped_edge
                              (pfVar67,uVar79,pnVar69,fVar115,fVar126,fVar122,fVar127);
                    fVar103 = fVar122;
                    fVar126 = fVar127;
                  }
LAB_00126a54:
                  nk_tt__handle_clipped_edge(pfVar67,uVar79,pnVar69,fVar103,fVar126,fVar133,fVar104)
                  ;
                  fVar127 = (float)local_390;
                  fVar115 = (float)local_338._0_4_;
                  uVar79 = uVar79 + 1;
                }
              }
              else {
                if (fVar126 <= fVar102) {
                  fVar126 = fVar102;
                }
                uVar79 = (uint)fVar122;
                if (fVar104 <= fVar103) {
                  fVar103 = fVar104;
                }
                uVar54 = (uint)fVar132;
                if (uVar79 == uVar54) {
                  if (((int)uVar79 < 0) || ((int)uVar92 <= (int)uVar79)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                                  ,0x2d95,
                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                 );
                  }
                  pfVar67[uVar79] =
                       (((fVar132 - (float)(int)uVar79) + (fVar122 - (float)(int)uVar79)) * -0.5 +
                       1.0) * pnVar69->direction * (fVar103 - fVar126) + pfVar67[uVar79];
                  scanline[(ulong)uVar79 + 1] =
                       (fVar103 - fVar126) * pnVar69->direction + scanline[(ulong)uVar79 + 1];
                }
                else {
                  fVar127 = pnVar69->fdy;
                  fVar128 = fVar132;
                  uVar55 = uVar79;
                  if (fVar132 < fVar122) {
                    fVar131 = fVar102 - fVar126;
                    fVar126 = (fVar102 - fVar103) + fVar104;
                    fVar127 = -fVar127;
                    fVar128 = fVar122;
                    uVar55 = uVar54;
                    uVar54 = uVar79;
                    fVar115 = fVar133;
                    fVar103 = fVar131 + fVar104;
                    fVar122 = fVar132;
                  }
                  fVar132 = (((float)(int)uVar55 + 1.0) - fVar115) * fVar127 + fVar102;
                  fVar115 = pnVar69->direction;
                  fVar133 = (fVar132 - fVar126) * fVar115;
                  pfVar67[(int)uVar55] =
                       (1.0 - ((fVar122 - (float)(int)uVar55) + 1.0) * 0.5) * fVar133 +
                       pfVar67[(int)uVar55];
                  lVar98 = (long)(int)uVar54;
                  for (lVar95 = (long)(int)(uVar55 + 1); lVar95 < lVar98; lVar95 = lVar95 + 1) {
                    pfVar67[lVar95] = fVar127 * fVar115 * 0.5 + fVar133 + pfVar67[lVar95];
                    fVar133 = fVar133 + fVar127 * fVar115;
                  }
                  pfVar67[lVar98] =
                       (fVar103 - (fVar127 * (float)(int)(uVar54 - (uVar55 + 1)) + fVar132)) *
                       (((fVar128 - (float)(int)uVar54) + 0.0) * -0.5 + 1.0) * fVar115 + fVar133 +
                       pfVar67[lVar98];
                  scanline[lVar98 + 1] = (fVar103 - fVar126) * fVar115 + scanline[lVar98 + 1];
                }
              }
            }
            else if (fVar115 < (float)local_3e8) {
              if (0.0 <= fVar115) {
                local_338 = ZEXT416((uint)fVar115);
                nk_tt__handle_clipped_edge
                          (pfVar67,(int)fVar115,pnVar69,fVar115,fVar102,fVar115,fVar104);
                iVar45 = (int)fVar115 + 1;
                auVar123 = local_338;
              }
              else {
                iVar45 = 0;
                auVar123 = ZEXT416((uint)fVar115);
              }
              nk_tt__handle_clipped_edge
                        (scanline,iVar45,pnVar69,auVar123._0_4_,fVar102,auVar123._0_4_,fVar104);
            }
          }
        }
        fVar102 = 0.0;
        uVar75 = local_278 & 0xffffffff;
        lVar98 = local_2b8;
        pfVar70 = pfVar67;
        while (bVar100 = lVar98 != 0, lVar98 = lVar98 + -1, bVar100) {
          fVar102 = fVar102 + pfVar70[local_2b0];
          fVar104 = *pfVar70 + fVar102;
          auVar124._0_4_ = -fVar104;
          auVar124._4_4_ = 0x80000000;
          auVar124._8_4_ = 0x80000000;
          auVar124._12_4_ = 0x80000000;
          if (auVar124._0_4_ <= fVar104) {
            auVar124._0_4_ = fVar104;
          }
          iVar45 = (int)(auVar124._0_4_ * 255.0 + 0.5);
          uVar82 = (undefined1)iVar45;
          if (0xfe < iVar45) {
            uVar82 = 0xff;
          }
          *(undefined1 *)(local_290 + (int)uVar75) = uVar82;
          uVar75 = (ulong)((int)uVar75 + 1);
          pfVar70 = pfVar70 + 1;
        }
        plVar65 = (long *)&x1;
        while (plVar65 = (long *)*plVar65, plVar65 != (long *)0x0) {
          *(float *)(plVar65 + 1) = *(float *)((long)plVar65 + 0xc) + *(float *)(plVar65 + 1);
        }
        iVar93 = iVar93 + 1;
        uVar77 = (ulong)(uint)((int)local_278 + local_3d4);
        iVar45 = local_37c + 1;
      }
      while (puVar64 != (undefined8 *)0x0) {
        puVar14 = (undefined8 *)*puVar64;
        (*(code *)local_358)(_y0,puVar64);
        puVar64 = puVar14;
      }
      if (pfVar67 != (float *)&x0) {
        (*(code *)alloc[2])(*alloc,pfVar67);
      }
      (*(code *)alloc[2])(*alloc,pnVar63);
    }
    (*(code *)alloc[2])(*alloc,pnVar62);
    nVar87 = *alloc;
    pnVar62 = local_3b8;
LAB_00126da9:
    (*(code *)alloc[2])(nVar87,pnVar62);
  }
LAB_00126dac:
  (*(code *)alloc[2])(*alloc,(void *)CONCAT44(local_3c8._4_4_,(int)local_3c8));
  uVar91 = alloc[6].id;
  uVar11 = *(undefined4 *)(lVar94 + 8);
  uVar79 = *(uint *)(lVar94 + 4);
  uVar77 = extraout_RDX;
  if (1 < uVar91) {
    iVar93 = alloc[5].id;
    lVar95 = (long)alloc[7].ptr +
             (ulong)(ushort)((uint)uVar11 >> 0x10) * (long)iVar93 + (ulong)(ushort)uVar11;
    lVar98 = (long)(int)((uVar79 & 0xffff) - uVar91);
    for (uVar92 = 0; uVar92 != uVar79 >> 0x10; uVar92 = uVar92 + 1) {
      nk_memset(&x0,uVar91,uVar77);
      uVar77 = extraout_RDX_00;
      switch(uVar91) {
      case 2:
        uVar75 = 0;
        for (uVar84 = 0; (long)uVar84 <= lVar98; uVar84 = uVar84 + 1) {
          bVar101 = *(byte *)(lVar95 + uVar84);
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          uVar77 = (ulong)bVar8;
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 2 & 7)) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)bVar8);
          uVar75 = (ulong)uVar54;
          *(char *)(lVar95 + uVar84) = (char)(uVar54 >> 1);
        }
        break;
      case 3:
        uVar75 = 0;
        for (uVar84 = 0; (long)uVar84 <= lVar98; uVar84 = uVar84 + 1) {
          bVar101 = *(byte *)(lVar95 + uVar84);
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 3 & 7)) = bVar101;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar101 - (uint)bVar8));
          uVar77 = uVar75 % 3;
          *(char *)(lVar95 + uVar84) = (char)(uVar75 / 3);
        }
        break;
      case 4:
        uVar75 = 0;
        for (uVar84 = 0; (long)uVar84 <= lVar98; uVar84 = uVar84 + 1) {
          bVar101 = *(byte *)(lVar95 + uVar84);
          uVar76 = (ulong)((uint)uVar84 & 7);
          uVar77 = uVar76 ^ 4;
          *(byte *)((long)&x0 + uVar77) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)*(byte *)((long)&x0 + uVar76));
          uVar75 = (ulong)uVar54;
          *(char *)(lVar95 + uVar84) = (char)(uVar54 >> 2);
        }
        break;
      case 5:
        uVar75 = 0;
        for (uVar84 = 0; (long)uVar84 <= lVar98; uVar84 = uVar84 + 1) {
          bVar101 = *(byte *)(lVar95 + uVar84);
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 5 & 7)) = bVar101;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar101 - (uint)bVar8));
          uVar77 = uVar75 % 5;
          *(char *)(lVar95 + uVar84) = (char)(uVar75 / 5);
        }
        break;
      default:
        uVar75 = 0;
        for (uVar84 = 0; (long)uVar84 <= lVar98; uVar84 = uVar84 + 1) {
          bVar101 = *(byte *)(lVar95 + uVar84);
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + uVar91 & 7)) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)bVar8);
          uVar75 = (ulong)uVar54;
          uVar77 = uVar75 % (ulong)uVar91;
          *(char *)(lVar95 + uVar84) = (char)(uVar54 / uVar91);
        }
      }
      for (uVar84 = uVar84 & 0xffffffff; uVar84 < (uVar79 & 0xffff); uVar84 = uVar84 + 1) {
        if (*(char *)(lVar95 + uVar84) != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x2ff1,"void nk_tt__h_prefilter(unsigned char *, int, int, int, int)");
        }
        uVar54 = (int)uVar75 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
        uVar75 = (ulong)uVar54;
        uVar77 = uVar75 % (ulong)uVar91;
        *(char *)(lVar95 + uVar84) = (char)(uVar54 / uVar91);
      }
      lVar95 = lVar95 + iVar93;
    }
    uVar11 = *(undefined4 *)(lVar94 + 8);
    uVar79 = *(uint *)(lVar94 + 4);
  }
  uVar91 = *(uint *)((long)alloc + 0x34);
  if (1 < uVar91) {
    lVar98 = (long)alloc[5].id;
    pbVar96 = (byte *)((long)alloc[7].ptr +
                      (ulong)(ushort)((uint)uVar11 >> 0x10) * lVar98 + (ulong)(ushort)uVar11);
    uVar66 = (ushort)(uVar79 >> 0x10);
    lVar95 = (long)(int)(uVar66 - uVar91);
    for (uVar92 = 0; uVar92 != (uVar79 & 0xffff); uVar92 = uVar92 + 1) {
      nk_memset(&x0,uVar91,uVar77);
      uVar77 = extraout_RDX_01;
      switch(uVar91) {
      case 2:
        uVar75 = 0;
        pbVar88 = pbVar96;
        for (uVar84 = 0; (long)uVar84 <= lVar95; uVar84 = uVar84 + 1) {
          bVar101 = *pbVar88;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 2 & 7)) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)bVar8);
          uVar75 = (ulong)uVar54;
          uVar54 = uVar54 >> 1;
          uVar77 = (ulong)uVar54;
          *pbVar88 = (byte)uVar54;
          pbVar88 = pbVar88 + lVar98;
        }
        break;
      case 3:
        uVar75 = 0;
        pbVar88 = pbVar96;
        for (uVar84 = 0; (long)uVar84 <= lVar95; uVar84 = uVar84 + 1) {
          bVar101 = *pbVar88;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 3 & 7)) = bVar101;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar101 - (uint)bVar8));
          uVar77 = uVar75 % 3;
          *pbVar88 = (byte)(uVar75 / 3);
          pbVar88 = pbVar88 + lVar98;
        }
        break;
      case 4:
        uVar75 = 0;
        pbVar88 = pbVar96;
        for (uVar84 = 0; (long)uVar84 <= lVar95; uVar84 = uVar84 + 1) {
          bVar101 = *pbVar88;
          uVar77 = (ulong)((uint)uVar84 & 7);
          *(byte *)((long)&x0 + (uVar77 ^ 4)) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)*(byte *)((long)&x0 + uVar77));
          uVar75 = (ulong)uVar54;
          uVar54 = uVar54 >> 2;
          uVar77 = (ulong)uVar54;
          *pbVar88 = (byte)uVar54;
          pbVar88 = pbVar88 + lVar98;
        }
        break;
      case 5:
        uVar75 = 0;
        pbVar88 = pbVar96;
        for (uVar84 = 0; (long)uVar84 <= lVar95; uVar84 = uVar84 + 1) {
          bVar101 = *pbVar88;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar84 + 5 & 7)) = bVar101;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar101 - (uint)bVar8));
          uVar77 = uVar75 % 5;
          *pbVar88 = (byte)(uVar75 / 5);
          pbVar88 = pbVar88 + lVar98;
        }
        break;
      default:
        uVar75 = 0;
        pbVar88 = pbVar96;
        for (uVar84 = 0; (long)uVar84 <= lVar95; uVar84 = uVar84 + 1) {
          bVar101 = *pbVar88;
          bVar8 = *(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar91 + (uint)uVar84 & 7)) = bVar101;
          uVar54 = (int)uVar75 + ((uint)bVar101 - (uint)bVar8);
          uVar75 = (ulong)uVar54;
          uVar77 = uVar75 % (ulong)uVar91;
          *pbVar88 = (byte)(uVar54 / uVar91);
          pbVar88 = pbVar88 + lVar98;
        }
      }
      pbVar88 = pbVar96 + uVar84 * lVar98;
      for (uVar84 = uVar84 & 0xffffffff; uVar84 < uVar66; uVar84 = uVar84 + 1) {
        if (*pbVar88 != 0) {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x3030,"void nk_tt__v_prefilter(unsigned char *, int, int, int, int)");
        }
        uVar54 = (int)uVar75 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar84 & 7));
        uVar75 = (ulong)uVar54;
        uVar77 = uVar75 % (ulong)uVar91;
        *pbVar88 = (byte)(uVar54 / uVar91);
        pbVar88 = pbVar88 + lVar98;
      }
      pbVar96 = pbVar96 + 1;
    }
    uVar11 = *(undefined4 *)(lVar94 + 8);
    uVar79 = *(uint *)(lVar94 + 4);
  }
  *local_288 = uVar11;
  uVar66 = (ushort)(uVar79 >> 0x10);
  local_288[1] = CONCAT22((short)((uint)uVar11 >> 0x10) + uVar66,(short)uVar11 + (short)uVar79);
  local_288[4] = (float)(int)(short)((short)(local_380 << 8) + (short)local_384) * local_2f8;
  auVar123._0_12_ = ZEXT812(0);
  auVar123._12_4_ = 0;
  *(ulong *)(local_288 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  *(ulong *)(local_288 + 5) =
       CONCAT44(((float)uVar66 + (float)y0_1) * local_258._4_4_ + local_248._4_4_,
                ((float)(uVar79 & 0xffff) + (float)x0_1) * local_258._0_4_ + local_248._0_4_);
  lVar95 = local_3f0;
  uVar77 = local_2c0;
  lVar81 = local_300;
  lVar98 = local_280;
  lVar94 = local_308;
  auVar129 = local_248;
LAB_001272c3:
  lVar98 = lVar98 + 1;
  lVar95 = lVar95 + 1;
  goto LAB_00125d76;
}

Assistant:

NK_API const void*
nk_font_atlas_bake(struct nk_font_atlas *atlas, int *width, int *height,
    enum nk_font_atlas_format fmt)
{
    int i = 0;
    void *tmp = 0;
    nk_size tmp_size, img_size;
    struct nk_font *font_iter;
    struct nk_font_baker *baker;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(width);
    NK_ASSERT(height);
    if (!atlas || !width || !height ||
        !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

#ifdef NK_INCLUDE_DEFAULT_FONT
    /* no font added so just use default font */
    if (!atlas->font_num)
        atlas->default_font = nk_font_atlas_add_default(atlas, 13.0f, 0);
#endif
    NK_ASSERT(atlas->font_num);
    if (!atlas->font_num) return 0;

    /* allocate temporary baker memory required for the baking process */
    nk_font_baker_memory(&tmp_size, &atlas->glyph_count, atlas->config, atlas->font_num);
    tmp = atlas->temporary.alloc(atlas->temporary.userdata,0, tmp_size);
    NK_ASSERT(tmp);
    if (!tmp) goto failed;

    /* allocate glyph memory for all fonts */
    baker = nk_font_baker(tmp, atlas->glyph_count, atlas->font_num, &atlas->temporary);
    atlas->glyphs = (struct nk_font_glyph*)atlas->permanent.alloc(
        atlas->permanent.userdata,0, sizeof(struct nk_font_glyph)*(nk_size)atlas->glyph_count);
    NK_ASSERT(atlas->glyphs);
    if (!atlas->glyphs)
        goto failed;

    /* pack all glyphs into a tight fit space */
    atlas->custom.w = (NK_CURSOR_DATA_W*2)+1;
    atlas->custom.h = NK_CURSOR_DATA_H + 1;
    if (!nk_font_bake_pack(baker, &img_size, width, height, &atlas->custom,
        atlas->config, atlas->font_num, &atlas->temporary))
        goto failed;

    /* allocate memory for the baked image font atlas */
    atlas->pixel = atlas->temporary.alloc(atlas->temporary.userdata,0, img_size);
    NK_ASSERT(atlas->pixel);
    if (!atlas->pixel)
        goto failed;

    /* bake glyphs and custom white pixel into image */
    nk_font_bake(baker, atlas->pixel, *width, *height,
        atlas->glyphs, atlas->glyph_count, atlas->config, atlas->font_num);
    nk_font_bake_custom_data(atlas->pixel, *width, *height, atlas->custom,
            nk_custom_cursor_data, NK_CURSOR_DATA_W, NK_CURSOR_DATA_H, '.', 'X');

    if (fmt == NK_FONT_ATLAS_RGBA32) {
        /* convert alpha8 image into rgba32 image */
        void *img_rgba = atlas->temporary.alloc(atlas->temporary.userdata,0,
                            (nk_size)(*width * *height * 4));
        NK_ASSERT(img_rgba);
        if (!img_rgba) goto failed;
        nk_font_bake_convert(img_rgba, *width, *height, atlas->pixel);
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = img_rgba;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;

    /* initialize each font */
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        struct nk_font *font = font_iter;
        struct nk_font_config *config = font->config;
        nk_font_init(font, config->size, config->fallback_glyph, atlas->glyphs,
            config->font, nk_handle_ptr(0));
    }

    /* initialize each cursor */
    {NK_STORAGE const struct nk_vec2 nk_cursor_data[NK_CURSOR_COUNT][3] = {
        /* Pos      Size        Offset */
        {{ 0, 3},   {12,19},    { 0, 0}},
        {{13, 0},   { 7,16},    { 4, 8}},
        {{31, 0},   {23,23},    {11,11}},
        {{21, 0},   { 9, 23},   { 5,11}},
        {{55,18},   {23, 9},    {11, 5}},
        {{73, 0},   {17,17},    { 9, 9}},
        {{55, 0},   {17,17},    { 9, 9}}
    };
    for (i = 0; i < NK_CURSOR_COUNT; ++i) {
        struct nk_cursor *cursor = &atlas->cursors[i];
        cursor->img.w = (unsigned short)*width;
        cursor->img.h = (unsigned short)*height;
        cursor->img.region[0] = (unsigned short)(atlas->custom.x + nk_cursor_data[i][0].x);
        cursor->img.region[1] = (unsigned short)(atlas->custom.y + nk_cursor_data[i][0].y);
        cursor->img.region[2] = (unsigned short)nk_cursor_data[i][1].x;
        cursor->img.region[3] = (unsigned short)nk_cursor_data[i][1].y;
        cursor->size = nk_cursor_data[i][1];
        cursor->offset = nk_cursor_data[i][2];
    }}
    /* free temporary memory */
    atlas->temporary.free(atlas->temporary.userdata, tmp);
    return atlas->pixel;

failed:
    /* error so cleanup all memory */
    if (tmp) atlas->temporary.free(atlas->temporary.userdata, tmp);
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
    return 0;
}